

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

mallinfo * mspace_mallinfo(mallinfo *__return_storage_ptr__,mspace msp)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  bVar12 = mparams.magic == 0;
  __return_storage_ptr__->smblks = 0;
  __return_storage_ptr__->hblks = 0;
  __return_storage_ptr__->hblkhd = 0;
  __return_storage_ptr__->usmblks = 0;
  __return_storage_ptr__->fsmblks = 0;
  __return_storage_ptr__->uordblks = 0;
  __return_storage_ptr__->fordblks = 0;
  __return_storage_ptr__->keepcost = 0;
  __return_storage_ptr__->arena = 0;
  __return_storage_ptr__->ordblks = 0;
  __return_storage_ptr__->smblks = 0;
  __return_storage_ptr__->hblks = 0;
  __return_storage_ptr__->hblkhd = 0;
  __return_storage_ptr__->usmblks = 0;
  __return_storage_ptr__->fsmblks = 0;
  __return_storage_ptr__->uordblks = 0;
  if (bVar12) {
    init_mparams();
  }
  if (*(ulong *)((long)msp + 0x28) != 0) {
    sVar1 = *(size_t *)((long)msp + 0x10);
    sVar4 = sVar1 + 0x50;
    sVar5 = 1;
    sVar6 = sVar4;
    for (puVar7 = (ulong *)((long)msp + 0x378); puVar7 != (ulong *)0x0; puVar7 = (ulong *)puVar7[2])
    {
      uVar2 = *puVar7;
      uVar8 = (int)uVar2 + 0x10;
      uVar9 = (ulong)(-uVar8 & 0xf);
      if ((uVar8 & 0xf) == 0) {
        uVar9 = 0;
      }
      for (uVar9 = uVar9 + uVar2;
          (((uVar2 <= uVar9 && (uVar9 != *(ulong *)((long)msp + 0x28))) &&
           (uVar9 < puVar7[1] + uVar2)) && (uVar10 = *(ulong *)(uVar9 + 8), uVar10 != 0xb));
          uVar9 = uVar9 + uVar11) {
        uVar11 = uVar10 & 0xfffffffffffffff8;
        uVar8 = (uint)uVar10 & 3;
        sVar6 = sVar6 + uVar11;
        uVar10 = 0;
        if (uVar8 == 1) {
          uVar10 = uVar11;
        }
        sVar5 = sVar5 + (uVar8 == 1);
        sVar4 = sVar4 + uVar10;
      }
    }
    __return_storage_ptr__->arena = sVar6;
    __return_storage_ptr__->ordblks = sVar5;
    lVar3 = *(long *)((long)msp + 0x358);
    __return_storage_ptr__->hblkhd = lVar3 - sVar6;
    __return_storage_ptr__->usmblks = *(size_t *)((long)msp + 0x360);
    __return_storage_ptr__->uordblks = lVar3 - sVar4;
    __return_storage_ptr__->fordblks = sVar4;
    __return_storage_ptr__->keepcost = sVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

struct mallinfo mspace_mallinfo(mspace msp) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return internal_mallinfo(ms);
}